

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  UnitTestImpl *pUVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestSuite *pTVar6;
  size_t width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  string kIndent;
  string kTestsuites;
  
  std::__cxx11::string::string((string *)&kTestsuites,"testsuites",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string((string *)&local_b0,"tests",(allocator *)&local_88);
  iVar3 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"failures",(allocator *)&local_88);
  iVar3 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"disabled",(allocator *)&local_88);
  iVar3 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"errors",(allocator *)&local_88);
  OutputJsonKey(stream,&kTestsuites,&local_b0,0,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b0);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string((string *)&local_b0,"random_seed",(allocator *)&local_88);
    OutputJsonKey(stream,&kTestsuites,&local_b0,unit_test->impl_->random_seed_,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::string((string *)&local_b0,"timestamp",&local_b1);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_88,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_88,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"time",&local_b1);
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_88,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_88,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_b0);
  TestPropertiesAsJson(&local_b0,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar5 = std::operator<<(stream,(string *)&local_b0);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  std::__cxx11::string::string((string *)&local_88,"AllTests",&local_89);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_88,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_b0);
  poVar5 = std::operator<<(stream,(string *)&kIndent);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)&kTestsuites);
  std::operator<<(poVar5,"\": [\n");
  bVar2 = false;
  for (iVar3 = 0; pUVar1 = unit_test->impl_,
      iVar3 < (int)((ulong)((long)(pUVar1->test_suites_).
                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pUVar1->test_suites_).
                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar3 = iVar3 + 1
      ) {
    pTVar6 = UnitTest::GetTestSuite(unit_test,iVar3);
    iVar4 = TestSuite::reportable_test_count(pTVar6);
    if (0 < iVar4) {
      if (bVar2) {
        std::operator<<(stream,",\n");
      }
      pTVar6 = UnitTest::GetTestSuite(unit_test,iVar3);
      bVar2 = true;
      PrintJsonTestSuite(stream,pTVar6);
    }
  }
  bVar2 = TestResult::Failed(&pUVar1->ad_hoc_test_result_);
  if (bVar2) {
    OutputJsonTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)&kIndent);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}